

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaL_loadfile(lua_State *L,char *filename)

{
  int iVar1;
  int __c;
  int iVar2;
  char *in_RSI;
  lua_State *in_RDI;
  int fnameindex;
  int c;
  int readstatus;
  int status;
  LoadF lf;
  undefined4 in_stack_ffffffffffffdfc0;
  undefined2 in_stack_ffffffffffffdfc4;
  undefined1 in_stack_ffffffffffffdfc6;
  undefined1 in_stack_ffffffffffffdfc7;
  undefined4 in_stack_ffffffffffffdfcc;
  undefined4 in_stack_ffffffffffffdfd0;
  undefined4 in_stack_ffffffffffffdfd4;
  FILE *local_2020;
  char *in_stack_ffffffffffffdfe8;
  void *in_stack_ffffffffffffdff0;
  lua_Reader in_stack_ffffffffffffdff8;
  lua_State *in_stack_ffffffffffffe000;
  uint local_4;
  
  iVar1 = lua_gettop(in_RDI);
  iVar1 = iVar1 + 1;
  if (in_RSI == (char *)0x0) {
    lua_pushlstring((lua_State *)CONCAT44(in_stack_ffffffffffffdfd4,in_stack_ffffffffffffdfd0),
                    (char *)CONCAT44(in_stack_ffffffffffffdfcc,iVar1),
                    CONCAT17(in_stack_ffffffffffffdfc7,
                             CONCAT16(in_stack_ffffffffffffdfc6,
                                      CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))
                            ));
    local_2020 = _stdin;
  }
  else {
    lua_pushfstring(in_RDI,"@%s",in_RSI);
    local_2020 = fopen(in_RSI,"r");
    if (local_2020 == (FILE *)0x0) {
      iVar1 = errfile((lua_State *)CONCAT44(in_stack_ffffffffffffdfd4,in_stack_ffffffffffffdfd0),
                      (char *)CONCAT44(in_stack_ffffffffffffdfcc,iVar1),
                      CONCAT13(in_stack_ffffffffffffdfc7,
                               CONCAT12(in_stack_ffffffffffffdfc6,in_stack_ffffffffffffdfc4)));
      return iVar1;
    }
  }
  __c = getc(local_2020);
  if (__c == 0x23) {
    do {
      __c = getc(local_2020);
      in_stack_ffffffffffffdfc7 = __c != -1 && __c != 10;
    } while (__c != -1 && __c != 10);
    if (__c == 10) {
      __c = getc(local_2020);
    }
  }
  if ((__c == 0x1b) && (in_RSI != (char *)0x0)) {
    local_2020 = freopen(in_RSI,"rb",local_2020);
    if (local_2020 == (FILE *)0x0) {
      iVar1 = errfile((lua_State *)CONCAT44(in_stack_ffffffffffffdfd4,in_stack_ffffffffffffdfd0),
                      (char *)CONCAT44(__c,iVar1),
                      CONCAT13(in_stack_ffffffffffffdfc7,
                               CONCAT12(in_stack_ffffffffffffdfc6,in_stack_ffffffffffffdfc4)));
      return iVar1;
    }
    do {
      __c = getc(local_2020);
      in_stack_ffffffffffffdfc6 = __c != -1 && __c != 0x1b;
    } while (__c != -1 && __c != 0x1b);
  }
  ungetc(__c,local_2020);
  lua_tolstring((lua_State *)CONCAT44(__c,iVar1),
                CONCAT13(in_stack_ffffffffffffdfc7,
                         CONCAT12(in_stack_ffffffffffffdfc6,in_stack_ffffffffffffdfc4)),
                (size_t *)in_RDI);
  local_4 = lua_load(in_stack_ffffffffffffe000,in_stack_ffffffffffffdff8,in_stack_ffffffffffffdff0,
                     in_stack_ffffffffffffdfe8);
  iVar2 = ferror(local_2020);
  if (in_RSI != (char *)0x0) {
    fclose(local_2020);
  }
  if (iVar2 == 0) {
    lua_remove((lua_State *)((ulong)local_4 << 0x20),__c);
  }
  else {
    lua_settop(in_RDI,iVar1);
    local_4 = errfile((lua_State *)CONCAT44(local_4,iVar2),(char *)CONCAT44(__c,iVar1),
                      CONCAT13(in_stack_ffffffffffffdfc7,
                               CONCAT12(in_stack_ffffffffffffdfc6,in_stack_ffffffffffffdfc4)));
  }
  return local_4;
}

Assistant:

static int luaL_loadfile(lua_State*L,const char*filename){
LoadF lf;
int status,readstatus;
int c;
int fnameindex=lua_gettop(L)+1;
lf.extraline=0;
if(filename==NULL){
lua_pushliteral(L,"=stdin");
lf.f=stdin;
}
else{
lua_pushfstring(L,"@%s",filename);
lf.f=fopen(filename,"r");
if(lf.f==NULL)return errfile(L,"open",fnameindex);
}
c=getc(lf.f);
if(c=='#'){
lf.extraline=1;
while((c=getc(lf.f))!=EOF&&c!='\n');
if(c=='\n')c=getc(lf.f);
}
if(c=="\033Lua"[0]&&filename){
lf.f=freopen(filename,"rb",lf.f);
if(lf.f==NULL)return errfile(L,"reopen",fnameindex);
while((c=getc(lf.f))!=EOF&&c!="\033Lua"[0]);
lf.extraline=0;
}
ungetc(c,lf.f);
status=lua_load(L,getF,&lf,lua_tostring(L,-1));
readstatus=ferror(lf.f);
if(filename)fclose(lf.f);
if(readstatus){
lua_settop(L,fnameindex);
return errfile(L,"read",fnameindex);
}
lua_remove(L,fnameindex);
return status;
}